

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFArray.cpp
# Opt level: O3

void __thiscall PDFArray::~PDFArray(PDFArray *this)

{
  pointer ppPVar1;
  
  (this->super_PDFObject).super_RefCountObject._vptr_RefCountObject =
       (_func_int **)&PTR__PDFArray_003a7f58;
  ppPVar1 = (this->mValues).super__Vector_base<PDFObject_*,_std::allocator<PDFObject_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppPVar1 !=
      (this->mValues).super__Vector_base<PDFObject_*,_std::allocator<PDFObject_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      RefCountObject::Release(&(*ppPVar1)->super_RefCountObject);
      ppPVar1 = ppPVar1 + 1;
    } while (ppPVar1 !=
             (this->mValues).super__Vector_base<PDFObject_*,_std::allocator<PDFObject_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    ppPVar1 = (this->mValues).super__Vector_base<PDFObject_*,_std::allocator<PDFObject_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppPVar1 != (pointer)0x0) {
    operator_delete(ppPVar1,(long)(this->mValues).
                                  super__Vector_base<PDFObject_*,_std::allocator<PDFObject_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar1)
    ;
  }
  PDFObject::~PDFObject(&this->super_PDFObject);
  return;
}

Assistant:

PDFArray::~PDFArray(void)
{
	PDFObjectVector::iterator it = mValues.begin();

	for(; it != mValues.end(); ++it)
		(*it)->Release();
}